

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_buf.h
# Opt level: O3

void __thiscall io_buf::~io_buf(io_buf *this)

{
  int *__ptr;
  char *__ptr_00;
  
  this->_vptr_io_buf = (_func_int **)&PTR_open_file_002d6080;
  __ptr = (this->files)._begin;
  if (__ptr != (int *)0x0) {
    free(__ptr);
  }
  (this->files)._begin = (int *)0x0;
  (this->files)._end = (int *)0x0;
  (this->files).end_array = (int *)0x0;
  __ptr_00 = (this->space)._begin;
  if (__ptr_00 != (char *)0x0) {
    free(__ptr_00);
  }
  (this->space)._begin = (char *)0x0;
  (this->space)._end = (char *)0x0;
  (this->space).end_array = (char *)0x0;
  return;
}

Assistant:

virtual ~io_buf()
  {
    files.delete_v();
    space.delete_v();
  }